

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

int ON_FontList::CompareFontCharacteristicsHash(ON_Font **lhs,ON_Font **rhs)

{
  ON_Font *this;
  ON_Font *this_00;
  ON_SHA1_Hash *a;
  ON_SHA1_Hash *b;
  ON_Font *rhs_font;
  ON_Font *lhs_font;
  ON_Font **rhs_local;
  ON_Font **lhs_local;
  
  if (lhs == rhs) {
    lhs_local._4_4_ = 0;
  }
  else if (lhs == (ON_Font **)0x0) {
    lhs_local._4_4_ = 1;
  }
  else if (rhs == (ON_Font **)0x0) {
    lhs_local._4_4_ = -1;
  }
  else {
    this = *lhs;
    this_00 = *rhs;
    if (this == this_00) {
      lhs_local._4_4_ = 0;
    }
    else if (this == (ON_Font *)0x0) {
      lhs_local._4_4_ = 1;
    }
    else if (this_00 == (ON_Font *)0x0) {
      lhs_local._4_4_ = -1;
    }
    else {
      a = ON_Font::FontCharacteristicsHash(this);
      b = ON_Font::FontCharacteristicsHash(this_00);
      lhs_local._4_4_ = ON_SHA1_Hash::Compare(a,b);
    }
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_FontList::CompareFontCharacteristicsHash(
  ON_Font const* const* lhs,
  ON_Font const* const* rhs
)
{
  ON_ManagedFonts_CompareFontPointer(lhs, rhs);
  return ON_SHA1_Hash::Compare(lhs_font->FontCharacteristicsHash(), rhs_font->FontCharacteristicsHash());
}